

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O3

void __thiscall preciseunitOps_equality1_Test::TestBody(preciseunitOps_equality1_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  double dVar4;
  precise_unit u1;
  precise_unit u2;
  int eqFailNeg;
  int eqFailPos;
  precise_unit u3;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  undefined1 local_60 [16];
  int local_50;
  int local_4c;
  undefined1 local_48 [16];
  double local_38;
  double local_30;
  
  iVar2 = 0;
  local_4c = 0;
  local_50 = 0;
  local_38 = 1.0;
  do {
    dVar4 = 0.0;
    do {
      local_70 = (undefined1  [8])local_38;
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_000039d2;
      local_60._0_8_ = local_38 + dVar4;
      local_60._8_8_ = &DAT_000039d2;
      local_48._0_8_ = local_38 - dVar4;
      local_48._8_8_ = &DAT_000039d2;
      local_30 = dVar4;
      bVar1 = units::precise_unit::operator==((precise_unit *)local_70,(precise_unit *)local_60);
      if (!bVar1) {
        local_4c = local_4c + 1;
      }
      bVar1 = units::precise_unit::operator==((precise_unit *)local_70,(precise_unit *)local_48);
      if (!bVar1) {
        iVar2 = iVar2 + 1;
        local_50 = iVar2;
      }
      dVar4 = local_30 + 1e-15;
    } while (dVar4 < 5e-13);
    local_38 = local_38 + 1e-15;
  } while (local_38 < 1.000000000002);
  local_60._0_8_ = local_60._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_70,"eqFailPos","0",&local_4c,(int *)local_60);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x2d9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._0_8_ + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._0_8_ = local_60._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_70,"eqFailNeg","0",&local_50,(int *)local_60);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x2da,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._0_8_ + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  return;
}

Assistant:

TEST(preciseunitOps, equality1)
{
    int eqFailPos = 0;
    int eqFailNeg = 0;
    double start = 1.0;
    while (start < (1.0 + 2e-12)) {
        double diff = 0.0;
        while (diff < 5e-13) {
            auto u1 = precise_unit(start, precise::V);
            auto u2 = precise_unit(start + diff, precise::V);
            auto u3 = precise_unit(start - diff, precise::V);
            if (u1 != u2) {
                ++eqFailPos;
            }
            if (u1 != u3) {
                ++eqFailNeg;
            }
            diff += 1e-15;
        }
        start += 1e-15;
    }
    EXPECT_EQ(eqFailPos, 0);
    EXPECT_EQ(eqFailNeg, 0);
}